

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O1

void Cba_BlastTable(Gia_Man_t *pNew,word *pTable,int *pFans,int nFans,int nOuts,Vec_Int_t *vRes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vMemory;
  ulong *pTruth;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  Vec_Int_t vLeaves;
  Vec_Int_t local_40;
  
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0;
  vMemory->nSize = 0;
  vMemory->pArray = (int *)0x0;
  iVar1 = 1 << ((byte)nFans - 6 & 0x1f);
  if (nFans < 7) {
    iVar1 = 1;
  }
  local_40.nCap = nFans;
  local_40.nSize = nFans;
  local_40.pArray = pFans;
  pTruth = (ulong *)malloc((long)iVar1 << 3);
  vRes->nSize = 0;
  if (0 < nOuts) {
    uVar10 = 1 << ((byte)nFans & 0x1f);
    iVar2 = 1;
    if (1U < (uint)nFans) {
      iVar2 = nFans;
    }
    iVar5 = 2;
    if (1U < (uint)nFans) {
      iVar5 = iVar2;
    }
    iVar2 = 3;
    if (iVar5 != 2) {
      iVar2 = iVar5;
    }
    if ((int)uVar10 < 2) {
      uVar10 = 1;
    }
    iVar9 = 0;
    do {
      memset(pTruth,0,(long)iVar1 << 3);
      if (nFans != 0x1f) {
        uVar4 = 0;
        uVar6 = 0;
        do {
          iVar3 = (int)uVar4;
          if (0 < nFans) {
            iVar11 = nFans;
            do {
              if ((pTable[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
                pTruth[uVar6 >> 6] = pTruth[uVar6 >> 6] | 1L << ((byte)uVar6 & 0x3f);
              }
              uVar4 = (ulong)((int)uVar4 + 1);
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          uVar6 = uVar6 + 1;
          uVar4 = (ulong)(uint)(iVar3 + nFans);
        } while (uVar6 != uVar10);
      }
      if (nFans < 6) {
        if (nFans < 0) {
          __assert_fail("nVars >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x489,"word Abc_Tt6Stretch(word, int)");
        }
        uVar7 = (uint)*pTruth;
        uVar6 = (uVar7 & 1) * 3;
        if (nFans != 0) {
          uVar6 = uVar7;
        }
        uVar4 = (ulong)(uVar6 & 3) * 5;
        if (1 < (uint)nFans) {
          uVar4 = *pTruth;
        }
        uVar6 = (uint)uVar4 & 0xf;
        uVar8 = (ulong)(uVar6 << 4 | uVar6);
        if (iVar5 != 2) {
          uVar8 = uVar4;
        }
        uVar4 = (ulong)(uint)((int)(uVar8 & 0xff) << 8) | uVar8 & 0xff;
        if (iVar2 != 3) {
          uVar4 = uVar8;
        }
        uVar8 = (ulong)((uint)uVar4 << 0x10 | (uint)uVar4 & 0xffff);
        if (1 < iVar2 - 3U) {
          uVar8 = uVar4;
        }
        *pTruth = uVar8 << 0x20 | uVar8 & 0xffffffff;
      }
      iVar3 = Kit_TruthToGia(pNew,(uint *)pTruth,nFans,vMemory,&local_40,1);
      Vec_IntPush(vRes,iVar3);
      iVar9 = iVar9 + 1;
    } while (iVar9 != nOuts);
  }
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
    vMemory->pArray = (int *)0x0;
  }
  free(vMemory);
  if (pTruth != (ulong *)0x0) {
    free(pTruth);
  }
  return;
}

Assistant:

void Cba_BlastTable( Gia_Man_t * pNew, word * pTable, int * pFans, int nFans, int nOuts, Vec_Int_t * vRes )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 0 );
    Vec_Int_t vLeaves = { nFans, nFans, pFans };
    word * pTruth = ABC_ALLOC( word, Abc_TtWordNum(nFans) );
    int o, i, m, iLit, nMints = (1 << nFans);
    Vec_IntClear( vRes );
    for ( o = 0; o < nOuts; o++ )
    {
        // derive truth table
        memset( pTruth, 0, sizeof(word) * Abc_TtWordNum(nFans) );
        for ( m = 0; m < nMints; m++ )
            for ( i = 0; i < nFans; i++ )
                if ( Abc_TtGetBit( pTable, m * nFans + i ) )
                    Abc_TtSetBit( pTruth, m );
        // implement truth table
        if ( nFans < 6 )
            pTruth[0] = Abc_Tt6Stretch( pTruth[0], nFans );
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, nFans, vMemory, &vLeaves, 1 );
        Vec_IntPush( vRes, iLit );
    }
    Vec_IntFree( vMemory );
    ABC_FREE( pTruth );
}